

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  reference pvVar1;
  cmFunctionBlocker *pcVar2;
  reference ppcVar3;
  cmListFileContext *lfc_00;
  ostream *poVar4;
  string local_1d8;
  undefined1 local_1b8 [8];
  ostringstream e;
  cmListFileContext *lfc;
  auto_ptr<cmFunctionBlocker> fb;
  size_type barrier;
  bool reportError_local;
  cmMakefile *this_local;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     (&this->FunctionBlockerBarriers);
  fb.x_ = (cmFunctionBlocker *)*pvVar1;
  barrier._7_1_ = reportError;
  while( true ) {
    pcVar2 = (cmFunctionBlocker *)
             std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::size
                       (&this->FunctionBlockers);
    if (pcVar2 <= fb.x_) break;
    ppcVar3 = std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::back
                        (&this->FunctionBlockers);
    cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr((auto_ptr<cmFunctionBlocker> *)&lfc,*ppcVar3);
    std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::pop_back
              (&this->FunctionBlockers);
    if ((barrier._7_1_ & 1) != 0) {
      pcVar2 = cmsys::auto_ptr<cmFunctionBlocker>::operator->((auto_ptr<cmFunctionBlocker> *)&lfc);
      lfc_00 = cmFunctionBlocker::GetStartingContext(pcVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      poVar4 = std::operator<<((ostream *)local_1b8,"A logical block opening on the line\n");
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = ::operator<<(poVar4,lfc_00);
      poVar4 = std::operator<<(poVar4,"\n");
      std::operator<<(poVar4,"is not closed.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_1d8,false);
      std::__cxx11::string::~string((string *)&local_1d8);
      barrier._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    }
    cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)&lfc);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            (&this->FunctionBlockerBarriers);
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while(this->FunctionBlockers.size() > barrier)
    {
    cmsys::auto_ptr<cmFunctionBlocker> fb(this->FunctionBlockers.back());
    this->FunctionBlockers.pop_back();
    if(reportError)
      {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      reportError = false;
      }
    }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}